

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

int Cec2_ManPerformSweeping(Gia_Man_t *p,Cec2_Par_t *pPars,Gia_Man_t **ppNew)

{
  Gia_Rpr_t GVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Gia_Obj_t *pGVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Cec2_Man_t *pMan;
  long lVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  size_t sVar15;
  char *pcVar16;
  Abc_Cex_t *pAVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  
  pMan = Cec2_ManCreate(p,pPars);
  Gia_ManRandomW(1);
  Gia_ManSetPhase(p);
  if (pPars->fIsMiter != 0) {
    lVar11 = (long)p->vCos->nSize;
    if (0 < lVar11) {
      lVar22 = 0;
      do {
        iVar8 = p->vCos->pArray[lVar22];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_006531e8;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (*(long *)(p->pObjs + iVar8) < 0) {
          pAVar17 = Abc_CexAlloc(0,p->vCis->nSize,1);
          pAVar17->iPo = (int)lVar22;
          p->pCexSeq = pAVar17;
          goto LAB_006531a5;
        }
        lVar22 = lVar22 + 1;
      } while (lVar11 != lVar22);
    }
  }
  Cec2_ManSimAlloc(p,pPars->nSimWords);
  Cec2_ManSimulateCis(p);
  Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan);
  if ((pPars->fIsMiter == 0) || (iVar8 = Cec2_ManSimulateCos(p), iVar8 != 0)) {
    Cec2_ManCreateClasses(p,pMan);
    Cec2_ManPrintStats(p,pPars,pMan);
    if (0 < pPars->nSimRounds) {
      iVar8 = 0;
      do {
        Cec2_ManSimulateCis(p);
        Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan);
        if ((pPars->fIsMiter != 0) && (iVar9 = Cec2_ManSimulateCos(p), iVar9 == 0))
        goto LAB_006531a5;
        Cec2_ManPrintStats(p,pPars,pMan);
        iVar8 = iVar8 + 1;
      } while (iVar8 < pPars->nSimRounds);
    }
    if (0 < pPars->nItersMax) {
      iVar8 = 0;
      do {
        pMan->nPatterns = 0;
        Cec2_ManSimulateCis(p);
        pMan->vCexTriples->nSize = 0;
        if (p->nObjs < 1) {
LAB_00652e2c:
          Cec2_ManPrintStats(p,pPars,pMan);
          break;
        }
        lVar11 = 0;
        lVar22 = 8;
        bVar7 = false;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar19 = *(ulong *)((long)pGVar2 + lVar22 + -8);
          if (((((uVar19 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) &&
               (*(int *)(&pGVar2->field_0x0 + lVar22) == -1)) &&
              (((uint)p->pReprs[lVar11] >> 0x1d & 1) == 0)) &&
             ((uVar10 = *(uint *)((long)pGVar2 +
                                 lVar22 + (ulong)(uint)((int)(uVar19 & 0x1fffffff) << 2) * -3),
              uVar10 != 0xffffffff &&
              (uVar21 = *(uint *)((long)pGVar2 +
                                 lVar22 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc) * -3),
              uVar21 != 0xffffffff)))) {
            if (((uint)p->pReprs[lVar11] >> 0x1c & 1) != 0) {
              __assert_fail("!Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                            ,0x3c7,
                            "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)");
            }
            if (((int)uVar10 < 0) || ((int)uVar21 < 0)) goto LAB_00653207;
            uVar10 = Gia_ManHashAnd(pMan->pNew,uVar10 ^ (uint)(uVar19 >> 0x1d) & 1,
                                    uVar21 ^ (uint)(uVar19 >> 0x3d) & 1);
            *(uint *)(&pGVar2->field_0x0 + lVar22) = uVar10;
            if ((int)uVar10 < 0) {
LAB_00653264:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            pGVar14 = pMan->pNew;
            uVar21 = (pGVar14->vCopies2).nSize;
            if (uVar21 == uVar10 >> 1) {
              if (pGVar14->nObjs <= (int)uVar21) goto LAB_006531e8;
              pGVar5 = pGVar14->pObjs + uVar21;
              uVar10 = Gia_ObjIsMuxType(pGVar5);
              *(ulong *)pGVar5 =
                   *(ulong *)pGVar5 & 0xffffffffbfffffff | (ulong)((uVar10 & 1) << 0x1e);
              Gia_ObjSetPhase(pMan->pNew,pGVar5);
              Vec_IntPush(&pMan->pNew->vCopies2,-1);
              pGVar14 = pMan->pNew;
              uVar21 = (pGVar14->vCopies2).nSize;
            }
            if (uVar21 != pGVar14->nObjs) {
              __assert_fail("Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                            ,0x3d1,
                            "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)");
            }
            GVar1 = p->pReprs[lVar11];
            uVar19 = (ulong)(uint)GVar1 & 0xfffffff;
            if (uVar19 != 0xfffffff) {
              if (p->nObjs <= (int)uVar19) goto LAB_006531e8;
              if (p->pObjs != (Gia_Obj_t *)0x0) {
                pGVar5 = p->pObjs + uVar19;
                uVar10 = pGVar5->Value;
                if (uVar10 != 0xffffffff) {
                  if (((int)*(uint *)(&pGVar2->field_0x0 + lVar22) < 0) || ((int)uVar10 < 0))
                  goto LAB_00653264;
                  uVar10 = *(uint *)(&pGVar2->field_0x0 + lVar22) ^ uVar10;
                  if (uVar10 < 2) {
                    if (uVar10 != -((int)((uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) ^
                                         (uint)((ulong)*(undefined8 *)((long)pGVar2 + lVar22 + -8)
                                               >> 0x20)) >> 0x1f)) {
                      __assert_fail("(pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                                    ,0x3d7,
                                    "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)"
                                   );
                    }
                    p->pReprs[lVar11] = (Gia_Rpr_t)((uint)GVar1 | 0x10000000);
                  }
                  else {
                    iVar9 = Cec2_ManSweepNode(pMan,(int)lVar11);
                    if (iVar9 == 0) {
                      *(undefined4 *)(&pGVar2->field_0x0 + lVar22) = 0xffffffff;
                      pGVar13 = p->pObjs;
                      if ((pGVar5 < pGVar13) || (pGVar13 + p->nObjs <= pGVar5)) goto LAB_006531c9;
                      iVar9 = p->iPatsPi;
                      if (iVar9 < 0) {
                        __assert_fail("Var >= 0 && !(c >> 1)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                      ,0x12e,"int Abc_Var2Lit(int, int)");
                      }
                      pVVar12 = pMan->vCexTriples;
                      uVar4 = *(undefined8 *)pGVar5;
                      uVar3 = *(undefined8 *)((long)pGVar2 + lVar22 + -8);
                      Vec_IntPush(pVVar12,(int)((ulong)((long)pGVar5 - (long)pGVar13) >> 2) *
                                          -0x55555555);
                      Vec_IntPush(pVVar12,(int)lVar11);
                      Vec_IntPush(pVVar12,iVar9 * 2 -
                                          ((int)((uint)((ulong)uVar4 >> 0x20) ^
                                                (uint)((ulong)uVar3 >> 0x20)) >> 0x1f));
                      bVar7 = true;
                    }
                    else if ((p->pReprs[lVar11].field_0x3 & 0x10) != 0) {
                      if ((int)pGVar5->Value < 0) goto LAB_00653207;
                      *(uint *)(&pGVar2->field_0x0 + lVar22) =
                           pGVar5->Value ^
                           ((uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) ^
                           (uint)((ulong)*(undefined8 *)((long)pGVar2 + lVar22 + -8) >> 0x20)) >>
                           0x1f;
                    }
                  }
                }
              }
            }
          }
          lVar11 = lVar11 + 1;
          lVar22 = lVar22 + 0xc;
        } while (lVar11 < p->nObjs);
        if (!bVar7) goto LAB_00652e2c;
        uVar10 = Cec2_ManSimulate(p,pMan->vCexTriples,pMan);
        if ((uVar10 != 0) && (pPars->fVerbose != 0)) {
          printf("Failed to resimulate %d times with pattern = %d  (total = %d).\n",(ulong)uVar10,
                 (ulong)(uint)pMan->nPatterns,(ulong)(uint)(pPars->nSimWords << 6));
        }
        if ((pPars->fIsMiter != 0) && (iVar9 = Cec2_ManSimulateCos(p), iVar9 == 0)) break;
        Cec2_ManPrintStats(p,pPars,pMan);
        iVar8 = iVar8 + 1;
      } while (iVar8 < pPars->nItersMax);
    }
    if (ppNew != (Gia_Man_t **)0x0) {
      iVar8 = p->nObjs;
      if (0 < iVar8) {
        lVar11 = 8;
        lVar22 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar19 = *(ulong *)((long)pGVar2 + lVar11 + -8);
          if (((uVar19 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) &&
             (*(int *)(&pGVar2->field_0x0 + lVar11) == -1)) {
            uVar10 = *(uint *)((long)pGVar2 +
                              lVar11 + (ulong)(uint)((int)(uVar19 & 0x1fffffff) << 2) * -3);
            if (((int)uVar10 < 0) ||
               (uVar21 = *(uint *)((long)pGVar2 +
                                  lVar11 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar21 < 0)) goto LAB_00653207;
            iVar8 = Gia_ManHashAnd(pMan->pNew,uVar10 ^ (uint)(uVar19 >> 0x1d) & 1,
                                   uVar21 ^ (uint)(uVar19 >> 0x3d) & 1);
            *(int *)(&pGVar2->field_0x0 + lVar11) = iVar8;
            iVar8 = p->nObjs;
          }
          lVar22 = lVar22 + 1;
          lVar11 = lVar11 + 0xc;
        } while (lVar22 < iVar8);
      }
      pVVar12 = p->vCos;
      if (0 < pVVar12->nSize) {
        lVar11 = 0;
        do {
          iVar8 = pVVar12->pArray[lVar11];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_006531e8:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar8;
          uVar4 = *(undefined8 *)pGVar2;
          uVar10 = pGVar2[-(ulong)((uint)uVar4 & 0x1fffffff)].Value;
          if ((int)uVar10 < 0) {
LAB_00653207:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar14 = pMan->pNew;
          uVar21 = uVar10 >> 1;
          if (pGVar14->nObjs <= (int)uVar21) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(pGVar14->pObjs + uVar21) & 0x1fffffff) != 0 &&
              (int)*(uint *)(pGVar14->pObjs + uVar21) < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar13 = Gia_ManAppendObj(pGVar14);
          uVar19 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar19 | 0x80000000;
          pGVar5 = pGVar14->pObjs;
          if ((pGVar13 < pGVar5) || (pGVar5 + pGVar14->nObjs <= pGVar13)) {
LAB_006531c9:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar18 = (ulong)(((uint)((int)pGVar13 - (int)pGVar5) >> 2) * -0x55555555 - uVar21 &
                          0x1fffffff);
          uVar20 = (ulong)((uVar10 << 0x1d ^ (uint)uVar4) & 0x20000000);
          *(ulong *)pGVar13 = uVar20 | uVar19 & 0xffffffffc0000000 | 0x80000000 | uVar18;
          *(ulong *)pGVar13 =
               uVar20 | uVar19 & 0xe0000000c0000000 | 0x80000000 | uVar18 |
               (ulong)(pGVar14->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar5 = pGVar14->pObjs;
          if ((pGVar13 < pGVar5) || (pGVar5 + pGVar14->nObjs <= pGVar13)) goto LAB_006531c9;
          Vec_IntPush(pGVar14->vCos,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555)
          ;
          if (pGVar14->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(pGVar14,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),
                             pGVar13);
          }
          pGVar5 = pGVar14->pObjs;
          if ((pGVar13 < pGVar5) || (pGVar5 + pGVar14->nObjs <= pGVar13)) goto LAB_006531c9;
          pGVar2->Value = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
          lVar11 = lVar11 + 1;
          pVVar12 = p->vCos;
        } while (lVar11 < pVVar12->nSize);
      }
      pGVar14 = Gia_ManCleanup(pMan->pNew);
      *ppNew = pGVar14;
      pcVar6 = p->pName;
      if (pcVar6 == (char *)0x0) {
        pcVar16 = (char *)0x0;
      }
      else {
        sVar15 = strlen(pcVar6);
        pcVar16 = (char *)malloc(sVar15 + 1);
        strcpy(pcVar16,pcVar6);
      }
      pGVar14->pName = pcVar16;
      pcVar6 = p->pSpec;
      if (pcVar6 == (char *)0x0) {
        pcVar16 = (char *)0x0;
      }
      else {
        sVar15 = strlen(pcVar6);
        pcVar16 = (char *)malloc(sVar15 + 1);
        strcpy(pcVar16,pcVar6);
      }
      (*ppNew)->pSpec = pcVar16;
    }
  }
LAB_006531a5:
  Cec2_ManDestroy(pMan);
  return (int)(p->pCexSeq == (Abc_Cex_t *)0x0);
}

Assistant:

int Cec2_ManPerformSweeping( Gia_Man_t * p, Cec2_Par_t * pPars, Gia_Man_t ** ppNew )
{
    Cec2_Man_t * pMan = Cec2_ManCreate( p, pPars ); 
    Gia_Obj_t * pObj, * pRepr, * pObjNew; 
    int i, Iter, fDisproved = 1;

    // check if any output trivially fails under all-0 pattern
    Gia_ManRandomW( 1 );
    Gia_ManSetPhase( p );
    if ( pPars->fIsMiter ) 
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( pObj->fPhase )
            {
                p->pCexSeq = Cec2_ManDeriveCex( p, i, -1 );
                goto finalize;
            }
    }

    // simulate one round and create classes
    Cec2_ManSimAlloc( p, pPars->nSimWords );
    Cec2_ManSimulateCis( p );
    Cec2_ManSimulate( p, NULL, pMan );
    if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
        goto finalize;
    Cec2_ManCreateClasses( p, pMan );
    Cec2_ManPrintStats( p, pPars, pMan );

    // perform additinal simulation
    for ( i = 0; i < pPars->nSimRounds; i++ )
    {
        Cec2_ManSimulateCis( p );
        Cec2_ManSimulate( p, NULL, pMan );
        if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
            goto finalize;
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // perform sweeping
    //pMan = Cec2_ManCreate( p, pPars );
    for ( Iter = 0; fDisproved && Iter < pPars->nItersMax; Iter++ )
    {
        fDisproved = 0;
        pMan->nPatterns = 0;
        Cec2_ManSimulateCis( p );
        Vec_IntClear( pMan->vCexTriples );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( ~pObj->Value || Gia_ObjFailed(p, i) ) // skip swept nodes and failed nodes
                continue;
            if ( !~Gia_ObjFanin0(pObj)->Value || !~Gia_ObjFanin1(pObj)->Value ) // skip fanouts of non-swept nodes
                continue;
            assert( !Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i) );
            // duplicate the node
            pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Vec_IntSize(&pMan->pNew->vCopies2) == Abc_Lit2Var(pObj->Value) )
            {
                pObjNew = Gia_ManObj( pMan->pNew, Abc_Lit2Var(pObj->Value) );
                pObjNew->fMark0 = Gia_ObjIsMuxType( pObjNew );
                Gia_ObjSetPhase( pMan->pNew, pObjNew );
                Vec_IntPush( &pMan->pNew->vCopies2, -1 );
            }
            assert( Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew) );
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL || !~pRepr->Value )
                continue;
            if ( Abc_Lit2Var(pObj->Value) == Abc_Lit2Var(pRepr->Value) )
            {
                assert( (pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase) );
                Gia_ObjSetProved( p, i );
                continue;
            }
            if ( Cec2_ManSweepNode(pMan, i) )
            {
                if ( Gia_ObjProved(p, i) )
                    pObj->Value = Abc_LitNotCond( pRepr->Value, pObj->fPhase ^ pRepr->fPhase );
                continue;
            }
            pObj->Value = ~0;
            Vec_IntPushThree( pMan->vCexTriples, Gia_ObjId(p, pRepr), i, Abc_Var2Lit(p->iPatsPi, pObj->fPhase ^ pRepr->fPhase) );
            fDisproved = 1;
        }
        if ( fDisproved )
        {
            int Fails = Cec2_ManSimulate( p, pMan->vCexTriples, pMan );
            if ( Fails && pPars->fVerbose )
                printf( "Failed to resimulate %d times with pattern = %d  (total = %d).\n", Fails, pMan->nPatterns, pPars->nSimWords * 64 );
            if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
                break;
        }
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // finish the AIG, if it is not finished
    if ( ppNew )
    {
        Gia_ManForEachAnd( p, pObj, i )
            if ( !~pObj->Value ) 
                pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        *ppNew = Gia_ManCleanup( pMan->pNew );
        (*ppNew)->pName = Abc_UtilStrsav( p->pName );
        (*ppNew)->pSpec = Abc_UtilStrsav( p->pSpec );
    }
finalize:
    Cec2_ManDestroy( pMan );
    //Gia_ManEquivPrintClasses( p, 1, 0 );
    return p->pCexSeq ? 0 : 1;
}